

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  bool bVar1;
  long in_RSI;
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  Status status;
  PosixWritableFile *this_local;
  
  SyncDirIfManifest((PosixWritableFile *)local_20);
  bVar1 = Status::ok((Status *)local_20);
  if (bVar1) {
    FlushBuffer((PosixWritableFile *)local_30);
    Status::operator=((Status *)local_20,(Status *)local_30);
    Status::~Status((Status *)local_30);
    bVar1 = Status::ok((Status *)local_20);
    if (bVar1) {
      SyncFd(this,*(int *)(in_RSI + 0x10010),(string *)(in_RSI + 0x10018));
    }
    else {
      Status::Status((Status *)this,(Status *)local_20);
    }
  }
  else {
    Status::Status((Status *)this,(Status *)local_20);
  }
  local_30[0xc] = '\x01';
  local_30[0xd] = '\0';
  local_30[0xe] = '\0';
  local_30[0xf] = '\0';
  Status::~Status((Status *)local_20);
  return (Status)(char *)this;
}

Assistant:

Status Sync() override {
    // Ensure new files referred to by the manifest are in the filesystem.
    //
    // This needs to happen before the manifest file is flushed to disk, to
    // avoid crashing in a state where the manifest refers to files that are not
    // yet on disk.
    Status status = SyncDirIfManifest();
    if (!status.ok()) {
      return status;
    }

    status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    return SyncFd(fd_, filename_);
  }